

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O3

STL * cacheSurface(STL *__return_storage_ptr__,ImportedUgrid *ugrid,
                  set<int,_std::less<int>,_std::allocator<int>_> *tags)

{
  vector<Parfait::Facet,_std::allocator<Parfait::Facet>_> *this;
  _Rb_tree_header *p_Var1;
  pointer pdVar2;
  double dVar3;
  int iVar4;
  pointer pdVar5;
  double dVar6;
  _Base_ptr p_Var7;
  iterator iVar8;
  pointer piVar9;
  int *piVar10;
  pointer piVar11;
  long lVar12;
  Facet *pFVar13;
  long lVar14;
  double *pdVar15;
  _Base_ptr p_Var16;
  Facet *pFVar17;
  iterator iVar18;
  ulong uVar19;
  byte bVar20;
  array<Parfait::Point<double>,_3UL> facet;
  Facet local_138;
  double local_d8;
  double adStack_d0 [6];
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  double local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar20 = 0;
  (__return_storage_ptr__->filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename).field_2;
  (__return_storage_ptr__->filename)._M_string_length = 0;
  (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
  this = &__return_storage_ptr__->facets;
  (__return_storage_ptr__->facets).
  super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->facets).
  super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->facets).
  super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar11 = (ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar9 = (ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (8 < (ulong)((long)piVar9 - (long)piVar11)) {
    p_Var1 = &(tags->_M_t)._M_impl.super__Rb_tree_header;
    lVar14 = 0;
    uVar19 = 0;
    do {
      p_Var7 = (tags->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var7 != (_Base_ptr)0x0) {
        iVar4 = (ugrid->triangleTags).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19];
        p_Var16 = &p_Var1->_M_header;
        do {
          if (iVar4 <= (int)*(size_t *)(p_Var7 + 1)) {
            p_Var16 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < iVar4];
        } while (p_Var7 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var16 != p_Var1) &&
           ((int)((_Rb_tree_header *)p_Var16)->_M_node_count <= iVar4)) {
          pdVar5 = (ugrid->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar10 = (int *)((long)piVar11 + lVar14);
          lVar12 = 4;
          do {
            dVar3 = pdVar5[(long)*piVar10 * 3 + 2];
            pdVar2 = pdVar5 + (long)*piVar10 * 3;
            dVar6 = pdVar2[1];
            *(double *)((long)adStack_d0 + lVar12 * 4) = *pdVar2;
            *(double *)((long)adStack_d0 + lVar12 * 4 + 8) = dVar6;
            *(double *)((long)adStack_d0 + lVar12 * 4 + 0x10) = dVar3;
            piVar10 = piVar10 + 1;
            lVar12 = lVar12 + 6;
          } while (lVar12 != 0x16);
          local_68 = adStack_d0[4];
          local_78 = adStack_d0[2];
          uStack_70 = adStack_d0[3];
          local_50 = local_98;
          local_60 = adStack_d0[5];
          uStack_58 = uStack_a0;
          local_38 = local_80;
          local_48 = local_90;
          uStack_40 = uStack_88;
          pdVar15 = &local_78;
          pFVar13 = &local_138;
          for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pFVar13->points)._M_elems[0].pos._M_elems[0] = *pdVar15;
            pdVar15 = pdVar15 + (ulong)bVar20 * -2 + 1;
            pFVar13 = (Facet *)((long)pFVar13 + (ulong)bVar20 * -0x10 + 8);
          }
          iVar8._M_current =
               (__return_storage_ptr__->facets).
               super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar8._M_current ==
              (__return_storage_ptr__->facets).
              super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::
            _M_realloc_insert<Parfait::Facet>(this,iVar8,&local_138);
          }
          else {
            pFVar13 = &local_138;
            iVar18._M_current = iVar8._M_current;
            for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
              ((iVar18._M_current)->points)._M_elems[0].pos._M_elems[0] =
                   (pFVar13->points)._M_elems[0].pos._M_elems[0];
              pFVar13 = (Facet *)((long)pFVar13 + (ulong)bVar20 * -0x10 + 8);
              iVar18._M_current = iVar18._M_current + (ulong)bVar20 * -0x10 + 8;
            }
            (__return_storage_ptr__->facets).
            super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar8._M_current + 1;
          }
          piVar11 = (ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar9 = (ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
      }
      uVar19 = uVar19 + 1;
      lVar14 = lVar14 + 0xc;
    } while (uVar19 < (ulong)((long)piVar9 - (long)piVar11 >> 2) / 3);
  }
  piVar11 = (ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar9 = (ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (0xf < (ulong)((long)piVar9 - (long)piVar11)) {
    p_Var1 = &(tags->_M_t)._M_impl.super__Rb_tree_header;
    uVar19 = 0;
    do {
      p_Var7 = (tags->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var7 != (_Base_ptr)0x0) {
        iVar4 = (ugrid->quadTags).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19];
        p_Var16 = &p_Var1->_M_header;
        do {
          if (iVar4 <= (int)*(size_t *)(p_Var7 + 1)) {
            p_Var16 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < iVar4];
        } while (p_Var7 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var16 != p_Var1) &&
           ((int)((_Rb_tree_header *)p_Var16)->_M_node_count <= iVar4)) {
          pdVar5 = (ugrid->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_d8 = pdVar5[(long)piVar11[uVar19 * 4 + 1] * 3];
          adStack_d0[0] = (pdVar5 + (long)piVar11[uVar19 * 4 + 1] * 3)[1];
          dVar3 = pdVar5[(long)piVar11[uVar19 * 4 + 1] * 3 + 2];
          local_138.points._M_elems[0].pos._M_elems[0] = pdVar5[(long)piVar11[uVar19 * 4] * 3];
          local_138.points._M_elems[0].pos._M_elems[1] = (pdVar5 + (long)piVar11[uVar19 * 4] * 3)[1]
          ;
          local_138.points._M_elems[0].pos._M_elems[2] = pdVar5[(long)piVar11[uVar19 * 4] * 3 + 2];
          local_138.points._M_elems[1].pos._M_elems[0] = local_d8;
          local_138.points._M_elems[1].pos._M_elems[1] = adStack_d0[0];
          local_138.points._M_elems[1].pos._M_elems[2] = dVar3;
          local_138.points._M_elems[2].pos._M_elems[0] = pdVar5[(long)piVar11[uVar19 * 4 + 2] * 3];
          local_138.points._M_elems[2].pos._M_elems[1] =
               (pdVar5 + (long)piVar11[uVar19 * 4 + 2] * 3)[1];
          local_138.points._M_elems[2].pos._M_elems[2] =
               pdVar5[(long)piVar11[uVar19 * 4 + 2] * 3 + 2];
          iVar8._M_current =
               (__return_storage_ptr__->facets).
               super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pFVar13 = (__return_storage_ptr__->facets).
                    super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          if (iVar8._M_current == pFVar13) {
            std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::
            _M_realloc_insert<Parfait::Facet>(this,iVar8,&local_138);
            iVar8._M_current =
                 (__return_storage_ptr__->facets).
                 super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            pFVar13 = (__return_storage_ptr__->facets).
                      super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          else {
            pFVar17 = &local_138;
            iVar18._M_current = iVar8._M_current;
            for (lVar14 = 0xc; lVar14 != 0; lVar14 = lVar14 + -1) {
              ((iVar18._M_current)->points)._M_elems[0].pos._M_elems[0] =
                   (pFVar17->points)._M_elems[0].pos._M_elems[0];
              pFVar17 = (Facet *)((long)pFVar17 + (ulong)bVar20 * -0x10 + 8);
              iVar18._M_current = iVar18._M_current + (ulong)bVar20 * -0x10 + 8;
            }
            iVar8._M_current = iVar8._M_current + 1;
            (__return_storage_ptr__->facets).
            super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar8._M_current;
          }
          pdVar5 = (ugrid->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_138.points._M_elems[0].pos._M_elems[0] = pdVar5[(long)piVar11[uVar19 * 4] * 3];
          local_138.points._M_elems[0].pos._M_elems[1] = (pdVar5 + (long)piVar11[uVar19 * 4] * 3)[1]
          ;
          local_138.points._M_elems[0].pos._M_elems[2] = pdVar5[(long)piVar11[uVar19 * 4] * 3 + 2];
          local_138.points._M_elems[1].pos._M_elems[0] = local_d8;
          local_138.points._M_elems[1].pos._M_elems[1] = adStack_d0[0];
          local_138.points._M_elems[1].pos._M_elems[2] = dVar3;
          local_138.points._M_elems[2].pos._M_elems[0] = pdVar5[(long)piVar11[uVar19 * 4 + 2] * 3];
          local_138.points._M_elems[2].pos._M_elems[1] =
               (pdVar5 + (long)piVar11[uVar19 * 4 + 2] * 3)[1];
          local_138.points._M_elems[2].pos._M_elems[2] =
               pdVar5[(long)piVar11[uVar19 * 4 + 2] * 3 + 2];
          if (iVar8._M_current == pFVar13) {
            std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::
            _M_realloc_insert<Parfait::Facet>(this,iVar8,&local_138);
          }
          else {
            pFVar13 = &local_138;
            iVar18._M_current = iVar8._M_current;
            for (lVar14 = 0xc; lVar14 != 0; lVar14 = lVar14 + -1) {
              ((iVar18._M_current)->points)._M_elems[0].pos._M_elems[0] =
                   (pFVar13->points)._M_elems[0].pos._M_elems[0];
              pFVar13 = (Facet *)((long)pFVar13 + (ulong)bVar20 * -0x10 + 8);
              iVar18._M_current = iVar18._M_current + (ulong)bVar20 * -0x10 + 8;
            }
            (__return_storage_ptr__->facets).
            super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar8._M_current + 1;
          }
          piVar11 = (ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar9 = (ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < (ulong)((long)piVar9 - (long)piVar11 >> 2) >> 2);
  }
  return __return_storage_ptr__;
}

Assistant:

auto cacheSurface(const Parfait::ImportedUgrid& ugrid, const std::set<int>& tags) {
    Parfait::STL::STL stl;
    for(int t = 0; t < ugrid.triangles.size() / 3; t++) {
        auto tri = &ugrid.triangles[3 * t + 0];
        int tag = ugrid.triangleTags[t];
        if (tags.count(tag) != 0) {
            std::array<Parfait::Point<double>, 3> facet;
            for (int i = 0; i < 3; i++) {
                int n = tri[i];
                const double *p = &ugrid.nodes[3 * n + 0];
                facet[i] = Parfait::Point<double>(p[0], p[1], p[2]);
            }
            stl.facets.push_back({facet[0], facet[1], facet[2]});
        }
    }

    for(int q = 0; q < ugrid.quads.size() / 4; q++) {
        auto quad = &ugrid.quads[4 * q + 0];
        int tag = ugrid.quadTags[q];
        if (tags.count(tag) != 0) {
            std::array<Parfait::Point<double>, 3> facet;
            const double *p;
            p = &ugrid.nodes[3 * quad[0] + 0];
            facet[0] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[1] + 0];
            facet[1] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[2] + 0];
            facet[2] = Parfait::Point<double>(p[0], p[1], p[2]);
            stl.facets.push_back({facet[0], facet[1], facet[2]});

            p = &ugrid.nodes[3 * quad[2] + 0];
            facet[2] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[3] + 0];
            facet[3] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[0] + 0];
            facet[0] = Parfait::Point<double>(p[0], p[1], p[2]);
            stl.facets.push_back({facet[0], facet[1], facet[2]});
        }
    }
    return stl;
}